

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O2

SDL_Color GPU_MakeColor(Uint8 r,Uint8 g,Uint8 b,Uint8 a)

{
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  undefined3 in_register_00000039;
  
  return (SDL_Color)
         ((int)CONCAT71(in_register_00000011,b) * 0x10000 + (uint)a * 0x1000000 |
          (int)CONCAT71(in_register_00000031,g) << 8 | CONCAT31(in_register_00000039,r));
}

Assistant:

SDL_Color GPU_MakeColor(Uint8 r, Uint8 g, Uint8 b, Uint8 a)
{
    SDL_Color c;
    c.r = r;
    c.g = g;
    c.b = b;
    GET_ALPHA(c) = a;

    return c;
}